

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::BeginFile
          (GoGenerator *this,string *name_space_name,bool needs_imports,bool is_enum,
          string *code_ptr)

{
  Parser *pPVar1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  GoGenerator *local_c8;
  IdlNamer *local_c0;
  _Rb_tree_node_base *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::operator+(&local_108,code_ptr,
                 "// Code generated by the FlatBuffers compiler. DO NOT EDIT.\n\n");
  std::__cxx11::string::operator=((string *)code_ptr,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator+(&local_e8,"package ",name_space_name);
  std::operator+(&local_108,&local_e8,"\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  if (needs_imports) {
    std::__cxx11::string::append((char *)code_ptr);
    if (this->needs_bytes_import_ == true) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    pPVar1 = (this->super_BaseGenerator).parser_;
    if ((pPVar1->opts).go_import._M_string_length == 0) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    else {
      std::operator+(&local_e8,"\tflatbuffers \"",&(pPVar1->opts).go_import);
      std::operator+(&local_108,&local_e8,"\"\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if (this->needs_math_import_ == true) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if (is_enum) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if ((this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      std::__cxx11::string::append((char *)code_ptr);
      local_b8 = &(this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_c0 = &this->namer_;
      local_c8 = this;
      for (p_Var3 = (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left; p_Var3 != local_b8;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        plVar2 = (long *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (p_Var3 + 1))[5]._M_string_length;
        if (*plVar2 == plVar2[1]) {
          std::operator+(&local_90,"\t",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (p_Var3 + 1));
          std::operator+(&local_70,&local_90," \"");
          std::operator+(&local_e8,&local_70,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (p_Var3 + 1));
          std::operator+(&local_108,&local_e8,"\"\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_70);
          this_00 = &local_90;
        }
        else {
          (*(local_c0->super_Namer)._vptr_Namer[10])(&local_b0,local_c0,plVar2);
          std::operator+(&local_90,"\t",&local_b0);
          std::operator+(&local_70,&local_90," \"");
          NamespaceImportPath_abi_cxx11_
                    (&local_50,local_c8,*(Namespace **)(*(long *)(p_Var3 + 1) + 0xa8));
          std::operator+(&local_e8,&local_70,&local_50);
          std::operator+(&local_108,&local_e8,"\"\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          this_00 = &local_b0;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
    }
  }
  else {
    if (is_enum) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if (this->needs_math_import_ != true) {
      return;
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 const bool is_enum, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code = code +
           "// Code generated by the FlatBuffers compiler. DO NOT EDIT.\n\n";
    code += "package " + name_space_name + "\n\n";
    if (needs_imports) {
      code += "import (\n";
      // standard imports, in alphabetical order for go fmt
      if (needs_bytes_import_) code += "\t\"bytes\"\n";
      if (!parser_.opts.go_import.empty()) {
        code += "\tflatbuffers \"" + parser_.opts.go_import + "\"\n";
      } else {
        code += "\tflatbuffers \"github.com/google/flatbuffers/go\"\n";
      }
      // math is needed to support non-finite scalar default values.
      if (needs_math_import_) { code += "\t\"math\"\n"; }
      if (is_enum) { code += "\t\"strconv\"\n"; }

      if (tracked_imported_namespaces_.size() > 0) {
        code += "\n";
        for (auto it = tracked_imported_namespaces_.begin();
             it != tracked_imported_namespaces_.end(); ++it) {
          if ((*it)->defined_namespace->components.empty()) {
            code += "\t" + (*it)->name + " \"" + (*it)->name + "\"\n";
          } else {
            code += "\t" + NamespaceImportName((*it)->defined_namespace) +
                    " \"" + NamespaceImportPath((*it)->defined_namespace) +
                    "\"\n";
          }
        }
      }
      code += ")\n\n";
    } else {
      if (is_enum) { code += "import \"strconv\"\n\n"; }
      if (needs_math_import_) {
        // math is needed to support non-finite scalar default values.
        code += "import \"math\"\n\n";
      }
    }
  }